

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

ModuleHeaderSyntax * __thiscall slang::parsing::Parser::parseModuleHeader(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token closeParen_00;
  span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> elements_00;
  Token openParen_00;
  Token openParen_01;
  SourceRange range;
  Token lifetime_00;
  Token star_00;
  Token moduleKeyword_00;
  Token closeParen_01;
  Token name_00;
  Token semi_00;
  Token TVar1;
  bool bVar2;
  int iVar3;
  SyntaxKind SVar4;
  undefined4 extraout_var;
  ModuleHeaderSyntax *pMVar5;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  undefined8 *in_RDI;
  Token TVar6;
  Token semi;
  optional<slang::SourceRange> errorRange;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token closeParen;
  Token star;
  Token dot;
  Token openParen;
  PortListSyntax *ports;
  ParameterPortListSyntax *parameterList;
  span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> imports;
  Token name;
  Token lifetime;
  Token moduleKeyword;
  ParserBase *in_stack_fffffffffffffbd8;
  undefined4 uVar7;
  SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *in_stack_fffffffffffffbe0;
  undefined4 in_stack_fffffffffffffbe8;
  undefined2 in_stack_fffffffffffffbec;
  TokenKind in_stack_fffffffffffffbee;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffbf0;
  undefined4 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffbfc;
  SourceLocation in_stack_fffffffffffffc00;
  SourceLocation in_stack_fffffffffffffc08;
  undefined4 in_stack_fffffffffffffc10;
  DiagCode in_stack_fffffffffffffc14;
  Info *in_stack_fffffffffffffc18;
  undefined4 in_stack_fffffffffffffc20;
  undefined4 in_stack_fffffffffffffc24;
  Parser *in_stack_fffffffffffffc28;
  SyntaxNode *in_stack_fffffffffffffc30;
  Info *in_stack_fffffffffffffc38;
  ParserBase *in_stack_fffffffffffffc40;
  SourceLocation in_stack_fffffffffffffc48;
  PortListSyntax *in_stack_fffffffffffffc50;
  undefined8 *in_stack_fffffffffffffc58;
  undefined7 in_stack_fffffffffffffc60;
  undefined1 in_stack_fffffffffffffc67;
  ParserBase *in_stack_fffffffffffffc70;
  Parser *in_stack_fffffffffffffcd8;
  undefined8 in_stack_fffffffffffffcf0;
  RequireItems requireItems;
  undefined1 in_stack_fffffffffffffcf8 [16];
  Token in_stack_fffffffffffffd08;
  DiagCode in_stack_fffffffffffffd20;
  anon_class_8_1_8991fb9c *in_stack_fffffffffffffd28;
  AllowEmpty in_stack_fffffffffffffd30;
  Parser *in_stack_fffffffffffffdc0;
  Token in_stack_fffffffffffffdc8;
  undefined1 local_1e8 [232];
  undefined1 local_100 [24];
  Parser *local_e8;
  ParserBase *local_e0;
  SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *local_d8;
  undefined8 local_d0;
  Info *local_c8;
  undefined8 local_c0;
  Info *local_b8;
  Token local_b0;
  Token local_a0;
  Token local_90;
  Token local_80;
  NonAnsiPortListSyntax *local_70;
  ParameterPortListSyntax *local_68;
  span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> local_60;
  Token local_50;
  Token local_40;
  Token local_30;
  
  requireItems = (RequireItems)((ulong)in_stack_fffffffffffffcf0 >> 0x20);
  local_30 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffc00);
  local_40 = parseLifetime((Parser *)in_stack_fffffffffffffbf0._M_extent_value);
  local_50 = ParserBase::expect(in_stack_fffffffffffffc70,(TokenKind)((ulong)in_RDI >> 0x30));
  local_60 = parsePackageImports((Parser *)
                                 CONCAT17(in_stack_fffffffffffffc67,in_stack_fffffffffffffc60));
  local_68 = parseParameterPortList(in_stack_fffffffffffffcd8);
  local_70 = (NonAnsiPortListSyntax *)0x0;
  bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffbf0._M_extent_value,
                           in_stack_fffffffffffffbee);
  if (bVar2) {
    local_80 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffc00);
    bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffbf0._M_extent_value,
                             in_stack_fffffffffffffbee);
    in_stack_fffffffffffffc67 = false;
    if (bVar2) {
      local_90 = ParserBase::peek((ParserBase *)
                                  CONCAT26(in_stack_fffffffffffffbee,
                                           CONCAT24(in_stack_fffffffffffffbec,
                                                    in_stack_fffffffffffffbe8)),
                                  (uint32_t)((ulong)in_stack_fffffffffffffbe0 >> 0x20));
      in_stack_fffffffffffffc67 = local_90.kind == Star;
    }
    if ((bool)in_stack_fffffffffffffc67 == false) {
      bVar2 = isNonAnsiPort(in_stack_fffffffffffffc28);
      if (bVar2) {
        in_stack_fffffffffffffc50 = (PortListSyntax *)local_100;
        Token::Token((Token *)in_stack_fffffffffffffbe0);
        uVar7 = (undefined4)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
        in_stack_fffffffffffffc48 = (SourceLocation)((long)local_1e8 + 0x10);
        SmallVector<slang::syntax::TokenOrSyntax,_8UL>::SmallVector
                  ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x879be9);
        local_1e8._12_4_ = 0x480005;
        in_stack_fffffffffffffbe0 =
             (SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)local_1e8;
        in_stack_fffffffffffffbd8 = (ParserBase *)CONCAT44(uVar7,0x480005);
        in_stack_fffffffffffffbe8 = 1;
        ParserBase::
        parseList<&slang::syntax::SyntaxFacts::isPossibleNonAnsiPort,&slang::syntax::SyntaxFacts::isEndOfParenList,slang::parsing::Parser::parseModuleHeader()::__0>
                  ((ParserBase *)in_stack_fffffffffffffd08.info,in_stack_fffffffffffffd08._0_8_,
                   in_stack_fffffffffffffcf8._14_2_,in_stack_fffffffffffffcf8._12_2_,
                   in_stack_fffffffffffffcf8._0_8_,requireItems,in_stack_fffffffffffffd20,
                   in_stack_fffffffffffffd28,in_stack_fffffffffffffd30);
        in_stack_fffffffffffffc30 = (SyntaxNode *)(in_RDI + 0x1c);
        iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)(local_1e8 + 0x10),
                           (EVP_PKEY_CTX *)*in_RDI,src);
        in_stack_fffffffffffffc40 = (ParserBase *)CONCAT44(extraout_var,iVar3);
        elements._M_ptr._4_2_ = in_stack_fffffffffffffbec;
        elements._M_ptr._0_4_ = in_stack_fffffffffffffbe8;
        elements._M_ptr._6_2_ = in_stack_fffffffffffffbee;
        elements._M_extent._M_extent_value = in_stack_fffffffffffffbf0._M_extent_value;
        in_stack_fffffffffffffc38 = extraout_RDX;
        slang::syntax::SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax>::SeparatedSyntaxList
                  (in_stack_fffffffffffffbe0,elements);
        openParen_01.rawLen = in_stack_fffffffffffffbfc;
        openParen_01.kind = (short)in_stack_fffffffffffffbf8;
        openParen_01._2_1_ = (char)((uint)in_stack_fffffffffffffbf8 >> 0x10);
        openParen_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffbf8 >> 0x18);
        openParen_01.info = (Info *)in_stack_fffffffffffffc00;
        closeParen_00.rawLen._0_2_ = in_stack_fffffffffffffbec;
        closeParen_00.kind = (short)in_stack_fffffffffffffbe8;
        closeParen_00._2_1_ = (char)((uint)in_stack_fffffffffffffbe8 >> 0x10);
        closeParen_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffbe8 >> 0x18);
        closeParen_00.rawLen._2_2_ = in_stack_fffffffffffffbee;
        closeParen_00.info = (Info *)in_stack_fffffffffffffbf0._M_extent_value;
        local_70 = slang::syntax::SyntaxFactory::nonAnsiPortList
                             ((SyntaxFactory *)in_stack_fffffffffffffbe0,openParen_01,
                              (SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)
                              in_stack_fffffffffffffbd8,closeParen_00);
        SmallVector<slang::syntax::TokenOrSyntax,_8UL>::~SmallVector
                  ((SmallVector<slang::syntax::TokenOrSyntax,_8UL> *)0x879d23);
      }
      else {
        local_70 = (NonAnsiPortListSyntax *)
                   parseAnsiPortList(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdc8);
      }
    }
    else {
      local_a0 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffc00);
      local_b0 = ParserBase::consume((ParserBase *)in_stack_fffffffffffffc00);
      TVar1 = local_80;
      TVar6 = local_a0;
      in_stack_fffffffffffffc58 = in_RDI + 0x1c;
      local_c0._0_2_ = local_80.kind;
      local_c0._2_1_ = local_80._2_1_;
      local_c0._3_1_ = local_80.numFlags.raw;
      local_c0._4_4_ = local_80.rawLen;
      local_80.info = TVar1.info;
      local_b8 = local_80.info;
      local_d0._0_2_ = local_a0.kind;
      local_d0._2_1_ = local_a0._2_1_;
      local_d0._3_1_ = local_a0.numFlags.raw;
      local_d0._4_4_ = local_a0.rawLen;
      local_a0.info = TVar6.info;
      local_c8 = local_a0.info;
      local_e0 = (ParserBase *)local_b0._0_8_;
      local_d8 = (SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)local_b0.info;
      local_a0 = TVar6;
      local_80 = TVar1;
      join_0x00000010_0x00000000_ =
           ParserBase::expect(in_stack_fffffffffffffc70,(TokenKind)((ulong)in_RDI >> 0x30));
      in_stack_fffffffffffffbe8 = local_100._16_4_;
      in_stack_fffffffffffffbec = local_100._20_2_;
      in_stack_fffffffffffffbee = local_100._22_2_;
      openParen_00.rawLen = in_stack_fffffffffffffbfc;
      openParen_00.kind = (short)in_stack_fffffffffffffbf8;
      openParen_00._2_1_ = (char)((uint)in_stack_fffffffffffffbf8 >> 0x10);
      openParen_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffbf8 >> 0x18);
      openParen_00.info = (Info *)in_stack_fffffffffffffc00;
      star_00.rawLen._0_2_ = in_stack_fffffffffffffc14.subsystem;
      star_00.rawLen._2_2_ = in_stack_fffffffffffffc14.code;
      star_00.kind = (short)in_stack_fffffffffffffc10;
      star_00._2_1_ = (char)((uint)in_stack_fffffffffffffc10 >> 0x10);
      star_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffc10 >> 0x18);
      star_00.info = in_stack_fffffffffffffc18;
      closeParen_01.rawLen = in_stack_fffffffffffffc24;
      closeParen_01.kind = (short)in_stack_fffffffffffffc20;
      closeParen_01._2_1_ = (char)((uint)in_stack_fffffffffffffc20 >> 0x10);
      closeParen_01.numFlags.raw = (char)((uint)in_stack_fffffffffffffc20 >> 0x18);
      closeParen_01.info = (Info *)in_stack_fffffffffffffc28;
      in_stack_fffffffffffffbd8 = local_e0;
      in_stack_fffffffffffffbe0 = local_d8;
      in_stack_fffffffffffffbf0._M_extent_value = (size_t)local_e8;
      local_70 = (NonAnsiPortListSyntax *)
                 slang::syntax::SyntaxFactory::wildcardPortList
                           ((SyntaxFactory *)local_d8,openParen_00,join_0x00000010_0x00000000_,
                            star_00,closeParen_01);
    }
  }
  if (local_30.kind == PackageKeyword) {
    std::optional<slang::SourceRange>::optional((optional<slang::SourceRange> *)0x879db1);
    bVar2 = std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>::
            empty((span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> *)
                  0x879dbe);
    if (bVar2) {
      if (local_68 == (ParameterPortListSyntax *)0x0) {
        if (local_70 != (NonAnsiPortListSyntax *)0x0) {
          slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc30);
          std::optional<slang::SourceRange>::operator=
                    ((optional<slang::SourceRange> *)in_stack_fffffffffffffbf0._M_extent_value,
                     (SourceRange *)
                     CONCAT26(in_stack_fffffffffffffbee,
                              CONCAT24(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)));
        }
      }
      else {
        slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc30);
        std::optional<slang::SourceRange>::operator=
                  ((optional<slang::SourceRange> *)in_stack_fffffffffffffbf0._M_extent_value,
                   (SourceRange *)
                   CONCAT26(in_stack_fffffffffffffbee,
                            CONCAT24(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)));
      }
    }
    else {
      std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>::operator[]
                (&local_60,0);
      slang::syntax::SyntaxNode::sourceRange(in_stack_fffffffffffffc30);
      std::optional<slang::SourceRange>::operator=
                ((optional<slang::SourceRange> *)in_stack_fffffffffffffbf0._M_extent_value,
                 (SourceRange *)
                 CONCAT26(in_stack_fffffffffffffbee,
                          CONCAT24(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8)));
    }
    bVar2 = std::optional::operator_cast_to_bool((optional<slang::SourceRange> *)0x879e92);
    if (bVar2) {
      std::optional<slang::SourceRange>::operator*((optional<slang::SourceRange> *)0x879eb2);
      range.endLoc = in_stack_fffffffffffffc08;
      range.startLoc = in_stack_fffffffffffffc00;
      ParserBase::addDiag((ParserBase *)
                          CONCAT44(in_stack_fffffffffffffbfc,in_stack_fffffffffffffbf8),
                          in_stack_fffffffffffffc14,range);
    }
  }
  else {
    bVar2 = std::span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL>::
            empty((span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> *)
                  0x879eff);
    if (((!bVar2) && (local_68 == (ParameterPortListSyntax *)0x0)) &&
       (local_70 == (NonAnsiPortListSyntax *)0x0)) {
      ParserBase::peek(in_stack_fffffffffffffbd8);
      Token::location((Token *)&stack0xfffffffffffffd08);
      ParserBase::addDiag(in_stack_fffffffffffffc40,
                          SUB84((ulong)in_stack_fffffffffffffc50 >> 0x20,0),
                          in_stack_fffffffffffffc48);
    }
  }
  TVar6 = ParserBase::expect(in_stack_fffffffffffffc70,(TokenKind)((ulong)in_RDI >> 0x30));
  in_RDI = in_RDI + 0x1c;
  SVar4 = slang::syntax::SyntaxFacts::getModuleHeaderKind(local_30.kind);
  elements_00._M_ptr._4_2_ = in_stack_fffffffffffffbec;
  elements_00._M_ptr._0_4_ = in_stack_fffffffffffffbe8;
  elements_00._M_ptr._6_2_ = in_stack_fffffffffffffbee;
  elements_00._M_extent._M_extent_value = in_stack_fffffffffffffbf0._M_extent_value;
  slang::syntax::SyntaxList<slang::syntax::PackageImportDeclarationSyntax>::SyntaxList
            ((SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)in_stack_fffffffffffffbe0,
             elements_00);
  moduleKeyword_00.info._0_4_ = in_stack_fffffffffffffc20;
  moduleKeyword_00._0_8_ = in_RDI;
  moduleKeyword_00.info._4_4_ = SVar4;
  lifetime_00.info._0_4_ = in_stack_fffffffffffffc10;
  lifetime_00._0_8_ = TVar6.info;
  lifetime_00.info._4_4_ = in_stack_fffffffffffffc14;
  name_00.info = in_stack_fffffffffffffc38;
  name_00._0_8_ = in_stack_fffffffffffffc30;
  semi_00.info._0_7_ = in_stack_fffffffffffffc60;
  semi_00._0_8_ = in_stack_fffffffffffffc58;
  semi_00.info._7_1_ = in_stack_fffffffffffffc67;
  pMVar5 = slang::syntax::SyntaxFactory::moduleHeader
                     (TVar6._0_8_,(SyntaxKind)((ulong)local_70 >> 0x20),moduleKeyword_00,lifetime_00
                      ,name_00,(SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)
                               in_stack_fffffffffffffc40,
                      (ParameterPortListSyntax *)in_stack_fffffffffffffc48,in_stack_fffffffffffffc50
                      ,semi_00);
  return pMVar5;
}

Assistant:

ModuleHeaderSyntax& Parser::parseModuleHeader() {
    auto moduleKeyword = consume();
    auto lifetime = parseLifetime();
    auto name = expect(TokenKind::Identifier);
    auto imports = parsePackageImports();
    auto parameterList = parseParameterPortList();

    PortListSyntax* ports = nullptr;
    if (peek(TokenKind::OpenParenthesis)) {
        auto openParen = consume();
        if (peek(TokenKind::Dot) && peek(1).kind == TokenKind::Star) {
            auto dot = consume();
            auto star = consume();
            ports = &factory.wildcardPortList(openParen, dot, star,
                                              expect(TokenKind::CloseParenthesis));
        }
        else if (isNonAnsiPort()) {
            Token closeParen;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleNonAnsiPort, isEndOfParenList>(
                buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen,
                RequireItems::True, diag::ExpectedNonAnsiPort,
                [this] { return &parseNonAnsiPort(); }, AllowEmpty::True);
            ports = &factory.nonAnsiPortList(openParen, buffer.copy(alloc), closeParen);
        }
        else {
            ports = &parseAnsiPortList(openParen);
        }
    }

    if (moduleKeyword.kind == TokenKind::PackageKeyword) {
        std::optional<SourceRange> errorRange;
        if (!imports.empty())
            errorRange = imports[0]->sourceRange();
        else if (parameterList)
            errorRange = parameterList->sourceRange();
        else if (ports)
            errorRange = ports->sourceRange();

        if (errorRange)
            addDiag(diag::InvalidPackageDecl, *errorRange);
    }
    else if (!imports.empty() && !parameterList && !ports) {
        addDiag(diag::ExpectedPortList, peek().location());
    }

    auto semi = expect(TokenKind::Semicolon);
    return factory.moduleHeader(getModuleHeaderKind(moduleKeyword.kind), moduleKeyword, lifetime,
                                name, imports, parameterList, ports, semi);
}